

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O2

void __thiscall
google::protobuf::TestUtil::ReflectionTester::ReflectionTester
          (ReflectionTester *this,Descriptor *base_descriptor)

{
  string *psVar1;
  DescriptorPool *this_00;
  pointer pcVar2;
  char *pcVar3;
  pointer pcVar4;
  pointer pcVar5;
  ushort *puVar6;
  bool bVar7;
  FieldDescriptor *pFVar8;
  Descriptor *pDVar9;
  EnumValueDescriptor *pEVar10;
  char *in_R9;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  string_view name_10;
  string_view name_11;
  string_view name_12;
  string_view name_13;
  string_view name_14;
  string_view name_15;
  string_view name_16;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  AssertHelper local_e0;
  string local_d8;
  string local_b8;
  AssertionResult gtest_ar_;
  
  this->base_descriptor_ = base_descriptor;
  psVar1 = base_descriptor->file_->package_;
  this_00 = base_descriptor->file_->pool_;
  pcVar2 = (psVar1->_M_dataplus)._M_p;
  pcVar3 = (char *)psVar1->_M_string_length;
  local_b8._M_dataplus._M_p = pcVar3;
  local_b8._M_string_length = (size_type)pcVar2;
  gtest_ar_ = (AssertionResult)
              absl::lts_20250127::NullSafeStringView(".TestAllTypes.optional_import_message");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_d8,(lts_20250127 *)&local_b8,(AlphaNum *)&gtest_ar_,(AlphaNum *)&gtest_ar_);
  name._M_str = local_d8._M_dataplus._M_p;
  name._M_len = local_d8._M_string_length;
  pFVar8 = DescriptorPool::FindFieldByName(this_00,name);
  std::__cxx11::string::~string((string *)&local_d8);
  pDVar9 = FieldDescriptor::message_type(pFVar8);
  psVar1 = pDVar9->file_->package_;
  pcVar4 = (psVar1->_M_dataplus)._M_p;
  pcVar5 = (pointer)psVar1->_M_string_length;
  local_b8._M_dataplus._M_p = pcVar3;
  local_b8._M_string_length = (size_type)pcVar2;
  gtest_ar_ = (AssertionResult)
              absl::lts_20250127::NullSafeStringView(".TestAllTypes.NestedMessage.bb");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_d8,(lts_20250127 *)&local_b8,(AlphaNum *)&gtest_ar_,(AlphaNum *)&gtest_ar_);
  name_00._M_str = local_d8._M_dataplus._M_p;
  name_00._M_len = local_d8._M_string_length;
  pFVar8 = DescriptorPool::FindFieldByName(this_00,name_00);
  this->nested_b_ = pFVar8;
  std::__cxx11::string::~string((string *)&local_d8);
  local_b8._M_dataplus._M_p = pcVar3;
  local_b8._M_string_length = (size_type)pcVar2;
  gtest_ar_ = (AssertionResult)absl::lts_20250127::NullSafeStringView(".ForeignMessage.c");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_d8,(lts_20250127 *)&local_b8,(AlphaNum *)&gtest_ar_,(AlphaNum *)&gtest_ar_);
  name_01._M_str = local_d8._M_dataplus._M_p;
  name_01._M_len = local_d8._M_string_length;
  pFVar8 = DescriptorPool::FindFieldByName(this_00,name_01);
  this->foreign_c_ = pFVar8;
  std::__cxx11::string::~string((string *)&local_d8);
  local_b8._M_dataplus._M_p = pcVar5;
  local_b8._M_string_length = (size_type)pcVar4;
  gtest_ar_ = (AssertionResult)absl::lts_20250127::NullSafeStringView(".ImportMessage.d");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_d8,(lts_20250127 *)&local_b8,(AlphaNum *)&gtest_ar_,(AlphaNum *)&gtest_ar_);
  name_02._M_str = local_d8._M_dataplus._M_p;
  name_02._M_len = local_d8._M_string_length;
  pFVar8 = DescriptorPool::FindFieldByName(this_00,name_02);
  this->import_d_ = pFVar8;
  std::__cxx11::string::~string((string *)&local_d8);
  local_b8._M_dataplus._M_p = pcVar5;
  local_b8._M_string_length = (size_type)pcVar4;
  gtest_ar_ = (AssertionResult)absl::lts_20250127::NullSafeStringView(".PublicImportMessage.e");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_d8,(lts_20250127 *)&local_b8,(AlphaNum *)&gtest_ar_,(AlphaNum *)&gtest_ar_);
  name_03._M_str = local_d8._M_dataplus._M_p;
  name_03._M_len = local_d8._M_string_length;
  pFVar8 = DescriptorPool::FindFieldByName(this_00,name_03);
  this->import_e_ = pFVar8;
  std::__cxx11::string::~string((string *)&local_d8);
  local_b8._M_dataplus._M_p = pcVar3;
  local_b8._M_string_length = (size_type)pcVar2;
  gtest_ar_ = (AssertionResult)absl::lts_20250127::NullSafeStringView(".TestAllTypes.FOO");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_d8,(lts_20250127 *)&local_b8,(AlphaNum *)&gtest_ar_,(AlphaNum *)&gtest_ar_);
  name_04._M_str = local_d8._M_dataplus._M_p;
  name_04._M_len = local_d8._M_string_length;
  pEVar10 = DescriptorPool::FindEnumValueByName(this_00,name_04);
  this->nested_foo_ = pEVar10;
  std::__cxx11::string::~string((string *)&local_d8);
  local_b8._M_dataplus._M_p = pcVar3;
  local_b8._M_string_length = (size_type)pcVar2;
  gtest_ar_ = (AssertionResult)absl::lts_20250127::NullSafeStringView(".TestAllTypes.BAR");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_d8,(lts_20250127 *)&local_b8,(AlphaNum *)&gtest_ar_,(AlphaNum *)&gtest_ar_);
  name_05._M_str = local_d8._M_dataplus._M_p;
  name_05._M_len = local_d8._M_string_length;
  pEVar10 = DescriptorPool::FindEnumValueByName(this_00,name_05);
  this->nested_bar_ = pEVar10;
  std::__cxx11::string::~string((string *)&local_d8);
  local_b8._M_dataplus._M_p = pcVar3;
  local_b8._M_string_length = (size_type)pcVar2;
  gtest_ar_ = (AssertionResult)absl::lts_20250127::NullSafeStringView(".TestAllTypes.BAZ");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_d8,(lts_20250127 *)&local_b8,(AlphaNum *)&gtest_ar_,(AlphaNum *)&gtest_ar_);
  name_06._M_str = local_d8._M_dataplus._M_p;
  name_06._M_len = local_d8._M_string_length;
  pEVar10 = DescriptorPool::FindEnumValueByName(this_00,name_06);
  this->nested_baz_ = pEVar10;
  std::__cxx11::string::~string((string *)&local_d8);
  local_b8._M_dataplus._M_p = pcVar3;
  local_b8._M_string_length = (size_type)pcVar2;
  gtest_ar_ = (AssertionResult)absl::lts_20250127::NullSafeStringView(".FOREIGN_FOO");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_d8,(lts_20250127 *)&local_b8,(AlphaNum *)&gtest_ar_,(AlphaNum *)&gtest_ar_);
  name_07._M_str = local_d8._M_dataplus._M_p;
  name_07._M_len = local_d8._M_string_length;
  pEVar10 = DescriptorPool::FindEnumValueByName(this_00,name_07);
  this->foreign_foo_ = pEVar10;
  std::__cxx11::string::~string((string *)&local_d8);
  local_b8._M_dataplus._M_p = pcVar3;
  local_b8._M_string_length = (size_type)pcVar2;
  gtest_ar_ = (AssertionResult)absl::lts_20250127::NullSafeStringView(".FOREIGN_BAR");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_d8,(lts_20250127 *)&local_b8,(AlphaNum *)&gtest_ar_,(AlphaNum *)&gtest_ar_);
  name_08._M_str = local_d8._M_dataplus._M_p;
  name_08._M_len = local_d8._M_string_length;
  pEVar10 = DescriptorPool::FindEnumValueByName(this_00,name_08);
  this->foreign_bar_ = pEVar10;
  std::__cxx11::string::~string((string *)&local_d8);
  local_b8._M_dataplus._M_p = pcVar3;
  local_b8._M_string_length = (size_type)pcVar2;
  gtest_ar_ = (AssertionResult)absl::lts_20250127::NullSafeStringView(".FOREIGN_BAZ");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_d8,(lts_20250127 *)&local_b8,(AlphaNum *)&gtest_ar_,(AlphaNum *)&gtest_ar_);
  name_09._M_str = local_d8._M_dataplus._M_p;
  name_09._M_len = local_d8._M_string_length;
  pEVar10 = DescriptorPool::FindEnumValueByName(this_00,name_09);
  this->foreign_baz_ = pEVar10;
  std::__cxx11::string::~string((string *)&local_d8);
  local_b8._M_dataplus._M_p = pcVar5;
  local_b8._M_string_length = (size_type)pcVar4;
  gtest_ar_ = (AssertionResult)absl::lts_20250127::NullSafeStringView(".IMPORT_FOO");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_d8,(lts_20250127 *)&local_b8,(AlphaNum *)&gtest_ar_,(AlphaNum *)&gtest_ar_);
  name_10._M_str = local_d8._M_dataplus._M_p;
  name_10._M_len = local_d8._M_string_length;
  pEVar10 = DescriptorPool::FindEnumValueByName(this_00,name_10);
  this->import_foo_ = pEVar10;
  std::__cxx11::string::~string((string *)&local_d8);
  local_b8._M_dataplus._M_p = pcVar5;
  local_b8._M_string_length = (size_type)pcVar4;
  gtest_ar_ = (AssertionResult)absl::lts_20250127::NullSafeStringView(".IMPORT_BAR");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_d8,(lts_20250127 *)&local_b8,(AlphaNum *)&gtest_ar_,(AlphaNum *)&gtest_ar_);
  name_11._M_str = local_d8._M_dataplus._M_p;
  name_11._M_len = local_d8._M_string_length;
  pEVar10 = DescriptorPool::FindEnumValueByName(this_00,name_11);
  this->import_bar_ = pEVar10;
  std::__cxx11::string::~string((string *)&local_d8);
  local_b8._M_dataplus._M_p = pcVar5;
  local_b8._M_string_length = (size_type)pcVar4;
  gtest_ar_ = (AssertionResult)absl::lts_20250127::NullSafeStringView(".IMPORT_BAZ");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_d8,(lts_20250127 *)&local_b8,(AlphaNum *)&gtest_ar_,(AlphaNum *)&gtest_ar_);
  name_12._M_str = local_d8._M_dataplus._M_p;
  name_12._M_len = local_d8._M_string_length;
  pEVar10 = DescriptorPool::FindEnumValueByName(this_00,name_12);
  this->import_baz_ = pEVar10;
  std::__cxx11::string::~string((string *)&local_d8);
  puVar6 = (ushort *)(this->base_descriptor_->all_names_).payload_;
  __x._M_len = (ulong)*puVar6;
  __x._M_str = (char *)((long)puVar6 + ~__x._M_len);
  __y._M_str = "TestAllExtensions";
  __y._M_len = 0x11;
  bVar7 = std::operator==(__x,__y);
  if (bVar7) {
    local_b8._M_dataplus._M_p = pcVar3;
    local_b8._M_string_length = (size_type)pcVar2;
    gtest_ar_ = (AssertionResult)
                absl::lts_20250127::NullSafeStringView(".OptionalGroup_extension.a");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_d8,(lts_20250127 *)&local_b8,(AlphaNum *)&gtest_ar_,(AlphaNum *)&gtest_ar_);
    name_13._M_str = local_d8._M_dataplus._M_p;
    name_13._M_len = local_d8._M_string_length;
    pFVar8 = DescriptorPool::FindFieldByName(this_00,name_13);
    this->group_a_ = pFVar8;
    std::__cxx11::string::~string((string *)&local_d8);
    local_b8._M_dataplus._M_p = pcVar3;
    local_b8._M_string_length = (size_type)pcVar2;
    gtest_ar_ = (AssertionResult)
                absl::lts_20250127::NullSafeStringView(".RepeatedGroup_extension.a");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_d8,(lts_20250127 *)&local_b8,(AlphaNum *)&gtest_ar_,(AlphaNum *)&gtest_ar_);
    name_14._M_str = local_d8._M_dataplus._M_p;
    name_14._M_len = local_d8._M_string_length;
    pFVar8 = DescriptorPool::FindFieldByName(this_00,name_14);
  }
  else {
    local_b8._M_dataplus._M_p = pcVar3;
    local_b8._M_string_length = (size_type)pcVar2;
    gtest_ar_ = (AssertionResult)
                absl::lts_20250127::NullSafeStringView(".TestAllTypes.OptionalGroup.a");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_d8,(lts_20250127 *)&local_b8,(AlphaNum *)&gtest_ar_,(AlphaNum *)&gtest_ar_);
    name_15._M_str = local_d8._M_dataplus._M_p;
    name_15._M_len = local_d8._M_string_length;
    pFVar8 = DescriptorPool::FindFieldByName(this_00,name_15);
    this->group_a_ = pFVar8;
    std::__cxx11::string::~string((string *)&local_d8);
    local_b8._M_dataplus._M_p = pcVar3;
    local_b8._M_string_length = (size_type)pcVar2;
    gtest_ar_ = (AssertionResult)
                absl::lts_20250127::NullSafeStringView(".TestAllTypes.RepeatedGroup.a");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_d8,(lts_20250127 *)&local_b8,(AlphaNum *)&gtest_ar_,(AlphaNum *)&gtest_ar_);
    name_16._M_str = local_d8._M_dataplus._M_p;
    name_16._M_len = local_d8._M_string_length;
    pFVar8 = DescriptorPool::FindFieldByName(this_00,name_16);
  }
  this->repeated_group_a_ = pFVar8;
  std::__cxx11::string::~string((string *)&local_d8);
  bVar7 = this->group_a_ != (FieldDescriptor *)0x0;
  gtest_ar_._1_7_ = gtest_ar_._1_7_;
  gtest_ar_.success_ = bVar7;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  if (!bVar7) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)&gtest_ar_,(AssertionResult *)0xdc9524,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x96,local_b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&local_b8);
    if ((long *)local_d8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_d8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  bVar7 = this->repeated_group_a_ != (FieldDescriptor *)0x0;
  gtest_ar_._1_7_ = gtest_ar_._1_7_;
  gtest_ar_.success_ = bVar7;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  if (!bVar7) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)&gtest_ar_,(AssertionResult *)"repeated_group_a_ != nullptr",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x97,local_b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&local_b8);
    if ((long *)local_d8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_d8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  bVar7 = this->nested_b_ != (FieldDescriptor *)0x0;
  gtest_ar_._1_7_ = gtest_ar_._1_7_;
  gtest_ar_.success_ = bVar7;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  if (!bVar7) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)&gtest_ar_,(AssertionResult *)"nested_b_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x98,local_b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&local_b8);
    if ((long *)local_d8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_d8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  bVar7 = this->foreign_c_ != (FieldDescriptor *)0x0;
  gtest_ar_._1_7_ = gtest_ar_._1_7_;
  gtest_ar_.success_ = bVar7;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  if (!bVar7) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)&gtest_ar_,(AssertionResult *)"foreign_c_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x99,local_b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&local_b8);
    if ((long *)local_d8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_d8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  bVar7 = this->import_d_ != (FieldDescriptor *)0x0;
  gtest_ar_._1_7_ = gtest_ar_._1_7_;
  gtest_ar_.success_ = bVar7;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  if (!bVar7) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)&gtest_ar_,(AssertionResult *)"import_d_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x9a,local_b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&local_b8);
    if ((long *)local_d8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_d8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  bVar7 = this->import_e_ != (FieldDescriptor *)0x0;
  gtest_ar_._1_7_ = gtest_ar_._1_7_;
  gtest_ar_.success_ = bVar7;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  if (!bVar7) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)&gtest_ar_,(AssertionResult *)"import_e_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x9b,local_b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&local_b8);
    if ((long *)local_d8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_d8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  bVar7 = this->nested_foo_ != (EnumValueDescriptor *)0x0;
  gtest_ar_._1_7_ = gtest_ar_._1_7_;
  gtest_ar_.success_ = bVar7;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  if (!bVar7) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)&gtest_ar_,(AssertionResult *)"nested_foo_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x9c,local_b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&local_b8);
    if ((long *)local_d8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_d8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  bVar7 = this->nested_bar_ != (EnumValueDescriptor *)0x0;
  gtest_ar_._1_7_ = gtest_ar_._1_7_;
  gtest_ar_.success_ = bVar7;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  if (!bVar7) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)&gtest_ar_,(AssertionResult *)"nested_bar_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x9d,local_b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&local_b8);
    if ((long *)local_d8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_d8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  bVar7 = this->nested_baz_ != (EnumValueDescriptor *)0x0;
  gtest_ar_._1_7_ = gtest_ar_._1_7_;
  gtest_ar_.success_ = bVar7;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  if (!bVar7) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)&gtest_ar_,(AssertionResult *)"nested_baz_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x9e,local_b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&local_b8);
    if ((long *)local_d8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_d8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  bVar7 = this->foreign_foo_ != (EnumValueDescriptor *)0x0;
  gtest_ar_._1_7_ = gtest_ar_._1_7_;
  gtest_ar_.success_ = bVar7;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  if (!bVar7) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)&gtest_ar_,(AssertionResult *)"foreign_foo_ != nullptr","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x9f,local_b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&local_b8);
    if ((long *)local_d8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_d8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  bVar7 = this->foreign_bar_ != (EnumValueDescriptor *)0x0;
  gtest_ar_._1_7_ = gtest_ar_._1_7_;
  gtest_ar_.success_ = bVar7;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  if (!bVar7) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)&gtest_ar_,(AssertionResult *)"foreign_bar_ != nullptr","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0xa0,local_b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&local_b8);
    if ((long *)local_d8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_d8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  bVar7 = this->foreign_baz_ != (EnumValueDescriptor *)0x0;
  gtest_ar_._1_7_ = gtest_ar_._1_7_;
  gtest_ar_.success_ = bVar7;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  if (!bVar7) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)&gtest_ar_,(AssertionResult *)"foreign_baz_ != nullptr","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0xa1,local_b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&local_b8);
    if ((long *)local_d8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_d8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  bVar7 = this->import_foo_ != (EnumValueDescriptor *)0x0;
  gtest_ar_._1_7_ = gtest_ar_._1_7_;
  gtest_ar_.success_ = bVar7;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  if (!bVar7) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)&gtest_ar_,(AssertionResult *)"import_foo_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0xa2,local_b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&local_b8);
    if ((long *)local_d8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_d8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  bVar7 = this->import_bar_ != (EnumValueDescriptor *)0x0;
  gtest_ar_._1_7_ = gtest_ar_._1_7_;
  gtest_ar_.success_ = bVar7;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  if (!bVar7) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)&gtest_ar_,(AssertionResult *)"import_bar_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0xa3,local_b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&local_b8);
    if ((long *)local_d8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_d8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  bVar7 = this->import_baz_ != (EnumValueDescriptor *)0x0;
  gtest_ar_._1_7_ = gtest_ar_._1_7_;
  gtest_ar_.success_ = bVar7;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  if (!bVar7) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)&gtest_ar_,(AssertionResult *)"import_baz_ != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0xa4,local_b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&local_b8);
    if ((long *)local_d8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_d8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

inline TestUtil::ReflectionTester::ReflectionTester(
    const Descriptor* base_descriptor)
    : base_descriptor_(base_descriptor) {
  const DescriptorPool* pool = base_descriptor->file()->pool();
  const absl::string_view package = base_descriptor->file()->package();
  const FieldDescriptor* import_descriptor = pool->FindFieldByName(
      absl::StrCat(package, ".TestAllTypes.optional_import_message"));
  const absl::string_view import_package =
      import_descriptor->message_type()->file()->package();

  nested_b_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestAllTypes.NestedMessage.bb"));
  foreign_c_ =
      pool->FindFieldByName(absl::StrCat(package, ".ForeignMessage.c"));
  import_d_ =
      pool->FindFieldByName(absl::StrCat(import_package, ".ImportMessage.d"));
  import_e_ = pool->FindFieldByName(
      absl::StrCat(import_package, ".PublicImportMessage.e"));
  nested_foo_ =
      pool->FindEnumValueByName(absl::StrCat(package, ".TestAllTypes.FOO"));
  nested_bar_ =
      pool->FindEnumValueByName(absl::StrCat(package, ".TestAllTypes.BAR"));
  nested_baz_ =
      pool->FindEnumValueByName(absl::StrCat(package, ".TestAllTypes.BAZ"));
  foreign_foo_ =
      pool->FindEnumValueByName(absl::StrCat(package, ".FOREIGN_FOO"));
  foreign_bar_ =
      pool->FindEnumValueByName(absl::StrCat(package, ".FOREIGN_BAR"));
  foreign_baz_ =
      pool->FindEnumValueByName(absl::StrCat(package, ".FOREIGN_BAZ"));
  import_foo_ =
      pool->FindEnumValueByName(absl::StrCat(import_package, ".IMPORT_FOO"));
  import_bar_ =
      pool->FindEnumValueByName(absl::StrCat(import_package, ".IMPORT_BAR"));
  import_baz_ =
      pool->FindEnumValueByName(absl::StrCat(import_package, ".IMPORT_BAZ"));

  if (base_descriptor_->name() == "TestAllExtensions") {
    group_a_ = pool->FindFieldByName(
        absl::StrCat(package, ".OptionalGroup_extension.a"));
    repeated_group_a_ = pool->FindFieldByName(
        absl::StrCat(package, ".RepeatedGroup_extension.a"));
  } else {
    group_a_ = pool->FindFieldByName(
        absl::StrCat(package, ".TestAllTypes.OptionalGroup.a"));
    repeated_group_a_ = pool->FindFieldByName(
        absl::StrCat(package, ".TestAllTypes.RepeatedGroup.a"));
  }

  EXPECT_TRUE(group_a_ != nullptr);
  EXPECT_TRUE(repeated_group_a_ != nullptr);
  EXPECT_TRUE(nested_b_ != nullptr);
  EXPECT_TRUE(foreign_c_ != nullptr);
  EXPECT_TRUE(import_d_ != nullptr);
  EXPECT_TRUE(import_e_ != nullptr);
  EXPECT_TRUE(nested_foo_ != nullptr);
  EXPECT_TRUE(nested_bar_ != nullptr);
  EXPECT_TRUE(nested_baz_ != nullptr);
  EXPECT_TRUE(foreign_foo_ != nullptr);
  EXPECT_TRUE(foreign_bar_ != nullptr);
  EXPECT_TRUE(foreign_baz_ != nullptr);
  EXPECT_TRUE(import_foo_ != nullptr);
  EXPECT_TRUE(import_bar_ != nullptr);
  EXPECT_TRUE(import_baz_ != nullptr);
}